

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

void sys_findprogdir(char *progname)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  stat statbuf;
  char sbuf2 [1000];
  char sbuf [1000];
  
  strncpy(sbuf,progname,1000);
  sbuf[999] = '\0';
  pcVar2 = strrchr(sbuf,0x2f);
  if (pcVar2 == (char *)0x0) {
    sbuf2[0] = '.';
    sbuf2[1] = '\0';
  }
  else {
    *pcVar2 = '\0';
    pcVar2 = strrchr(sbuf,0x2f);
    if (pcVar2 == (char *)0x0) {
      sbuf2[2] = '\0';
      sbuf2[0] = '.';
      sbuf2[1] = '.';
    }
    else {
      sVar3 = (long)pcVar2 - (long)sbuf;
      strncpy(sbuf2,sbuf,sVar3);
      sbuf2[sVar3] = '\0';
    }
  }
  strncpy(sbuf,sbuf2,0x3ca);
  sbuf[0x3ca] = '\0';
  sVar3 = strlen(sbuf);
  builtin_strncpy(sbuf + sVar3,"/lib/pd",8);
  iVar1 = stat(sbuf,(stat *)&statbuf);
  pcVar2 = sbuf;
  if (iVar1 < 0) {
    pcVar2 = sbuf2;
  }
  sys_libdir = gensym(pcVar2);
  return;
}

Assistant:

void sys_findprogdir(const char *progname)
{
    char sbuf[MAXPDSTRING], sbuf2[MAXPDSTRING];
    char *lastslash;
#ifndef _WIN32
    struct stat statbuf;
#endif /* NOT _WIN32 */

    /* find out by what string Pd was invoked; put answer in "sbuf". */
#ifdef _WIN32
    GetModuleFileName(NULL, sbuf2, sizeof(sbuf2));
    sbuf2[MAXPDSTRING-1] = 0;
    sys_unbashfilename(sbuf2, sbuf);
#else
    strncpy(sbuf, progname, MAXPDSTRING);
    sbuf[MAXPDSTRING-1] = 0;
#endif /* _WIN32 */
    lastslash = strrchr(sbuf, '/');
    if (lastslash)
    {
            /* bash last slash to zero so that sbuf is directory pd was in,
                e.g., ~/pd/bin */
        *lastslash = 0;
            /* go back to the parent from there, e.g., ~/pd */
        lastslash = strrchr(sbuf, '/');
        if (lastslash)
        {
            strncpy(sbuf2, sbuf, lastslash-sbuf);
            sbuf2[lastslash-sbuf] = 0;
        }
        else strcpy(sbuf2, "..");
    }
    else
    {
            /* no slashes found.  Try INSTALL_PREFIX. */
#ifdef INSTALL_PREFIX
        strcpy(sbuf2, INSTALL_PREFIX);
#else
        strcpy(sbuf2, ".");
#endif
    }
        /* now we believe sbuf2 holds the parent directory of the directory
        pd was found in.  We now want to infer the "lib" directory and the
        "gui" directory.  In "simple" unix installations, the layout is
            .../bin/pd
            .../bin/pd-watchdog (etc)
            .../bin/pd-gui.tcl
            .../doc
        and in "complicated" unix installations, it's:
            .../bin/pd
            .../lib/pd/bin/pd-watchdog
            .../lib/pd/bin/pd-gui.tcl
            .../lib/pd/doc
        To decide which, we stat .../lib/pd; if that exists, we assume it's
        the complicated layout.  In MSW, it's the "simple" layout, but
        "wish" is found in bin:
            .../bin/pd
            .../bin/wish80.exe
            .../doc
        */
#ifdef _WIN32
    sys_libdir = gensym(sbuf2);
#else
    strncpy(sbuf, sbuf2, MAXPDSTRING-30);
    sbuf[MAXPDSTRING-30] = 0;
    strcat(sbuf, "/lib/pd");
    if (stat(sbuf, &statbuf) >= 0)
    {
            /* complicated layout: lib dir is the one we just stat-ed above */
        sys_libdir = gensym(sbuf);
    }
    else
    {
            /* simple layout: lib dir is the parent */
        sys_libdir = gensym(sbuf2);
    }
#endif
}